

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

void PaUtil_BeginBufferProcessing
               (PaUtilBufferProcessor *bp,PaStreamCallbackTimeInfo *timeInfo,
               PaStreamCallbackFlags callbackStatusFlags)

{
  unsigned_long uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  PaStreamCallbackFlags callbackStatusFlags_local;
  PaStreamCallbackTimeInfo *timeInfo_local;
  PaUtilBufferProcessor *bp_local;
  
  bp->timeInfo = timeInfo;
  uVar1 = bp->framesInTempInputBuffer;
  auVar3._8_4_ = (int)(uVar1 >> 0x20);
  auVar3._0_8_ = uVar1;
  auVar3._12_4_ = 0x45300000;
  bp->timeInfo->inputBufferAdcTime =
       bp->timeInfo->inputBufferAdcTime -
       ((auVar3._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * bp->samplePeriod;
  uVar1 = bp->framesInTempOutputBuffer;
  auVar2._8_4_ = (int)(uVar1 >> 0x20);
  auVar2._0_8_ = uVar1;
  auVar2._12_4_ = 0x45300000;
  bp->timeInfo->outputBufferDacTime =
       ((auVar2._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * bp->samplePeriod +
       bp->timeInfo->outputBufferDacTime;
  bp->callbackStatusFlags = callbackStatusFlags;
  bp->hostInputFrameCount[1] = 0;
  bp->hostOutputFrameCount[1] = 0;
  return;
}

Assistant:

void PaUtil_BeginBufferProcessing( PaUtilBufferProcessor* bp,
        PaStreamCallbackTimeInfo* timeInfo, PaStreamCallbackFlags callbackStatusFlags )
{
    bp->timeInfo = timeInfo;

    /* the first streamCallback will be called to process samples which are
        currently in the input buffer before the ones starting at the timeInfo time */
        
    bp->timeInfo->inputBufferAdcTime -= bp->framesInTempInputBuffer * bp->samplePeriod;
    
    /* We just pass through timeInfo->currentTime provided by the caller. This is
        not strictly conformant to the word of the spec, since the buffer processor 
        might call the callback multiple times, and we never refresh currentTime. */

    /* the first streamCallback will be called to generate samples which will be
        outputted after the frames currently in the output buffer have been
        outputted. */
    bp->timeInfo->outputBufferDacTime += bp->framesInTempOutputBuffer * bp->samplePeriod;

    bp->callbackStatusFlags = callbackStatusFlags;

    bp->hostInputFrameCount[1] = 0;
    bp->hostOutputFrameCount[1] = 0;
}